

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

int __thiscall
tcmalloc::CentralFreeList::FetchFromOneSpans(CentralFreeList *this,int N,void **start,void **end)

{
  Span *span;
  anon_union_8_2_4d86d181_for_Span_4 aVar1;
  anon_union_8_2_4d86d181_for_Span_4 aVar2;
  anon_union_8_2_4d86d181_for_Span_4 aVar3;
  long lVar4;
  
  span = (this->nonempty_).next;
  if (span == &this->nonempty_) {
    lVar4 = 0;
  }
  else {
    aVar2 = (anon_union_8_2_4d86d181_for_Span_4)(span->field_4).objects;
    lVar4 = 0;
    aVar1 = aVar2;
    do {
      aVar3 = aVar1;
      aVar1 = *aVar3.objects;
      lVar4 = lVar4 + 1;
      if (N <= (int)lVar4) break;
    } while (aVar1.objects != (void *)0x0);
    if (aVar1.objects == (void *)0x0) {
      DLL_Remove(span);
      DLL_Prepend(&this->empty_,span);
      aVar2 = span->field_4;
    }
    *start = (void *)aVar2;
    *end = (void *)aVar3;
    (span->field_4).objects = (void *)aVar1;
    *(undefined8 *)*end = 0;
    *(short *)&span->field_0x28 = (short)*(undefined4 *)&span->field_0x28 + (short)lVar4;
    this->counter_ = this->counter_ - lVar4;
  }
  return (int)lVar4;
}

Assistant:

int CentralFreeList::FetchFromOneSpans(int N, void **start, void **end) {
  if (tcmalloc::DLL_IsEmpty(&nonempty_)) return 0;
  Span* span = nonempty_.next;

  ASSERT(span->objects != nullptr);

  int result = 0;
  void *prev, *curr;
  curr = span->objects;
  do {
    prev = curr;
    curr = *(reinterpret_cast<void**>(curr));
  } while (++result < N && curr != nullptr);

  if (curr == nullptr) {
    // Move to empty list
    tcmalloc::DLL_Remove(span);
    tcmalloc::DLL_Prepend(&empty_, span);
  }

  *start = span->objects;
  *end = prev;
  span->objects = curr;
  SLL_SetNext(*end, nullptr);
  span->refcount += result;
  counter_ -= result;
  return result;
}